

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx *dctx,ZSTD_dParameter dParam,int value)

{
  int iVar1;
  int local_20;
  int value_local;
  ZSTD_dParameter dParam_local;
  ZSTD_DCtx *dctx_local;
  
  if (dctx->streamStage == zdss_init) {
    if (dParam == ZSTD_d_windowLogMax) {
      local_20 = value;
      if (value == 0) {
        local_20 = 0x1b;
      }
      iVar1 = ZSTD_dParam_withinBounds(ZSTD_d_windowLogMax,local_20);
      if (iVar1 == 0) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffd6;
      }
      else {
        dctx->maxWindowSize = 1L << ((byte)local_20 & 0x3f);
        dctx_local = (ZSTD_DCtx *)0x0;
      }
    }
    else if (dParam == ZSTD_d_experimentalParam1) {
      iVar1 = ZSTD_dParam_withinBounds(ZSTD_d_experimentalParam1,value);
      if (iVar1 == 0) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffd6;
      }
      else {
        dctx->format = value;
        dctx_local = (ZSTD_DCtx *)0x0;
      }
    }
    else {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffd8;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffc4;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx* dctx, ZSTD_dParameter dParam, int value)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong);
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            if (value == 0) value = ZSTD_WINDOWLOG_LIMIT_DEFAULT;
            CHECK_DBOUNDS(ZSTD_d_windowLogMax, value);
            dctx->maxWindowSize = ((size_t)1) << value;
            return 0;
        case ZSTD_d_format:
            CHECK_DBOUNDS(ZSTD_d_format, value);
            dctx->format = (ZSTD_format_e)value;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported);
}